

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::EnumValueDescriptorProto::EnumValueDescriptorProto(EnumValueDescriptorProto *this)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__EnumValueDescriptorProto_0070b560;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = 0;
  if (this != (EnumValueDescriptorProto *)&_EnumValueDescriptorProto_default_instance_) {
    protobuf_google_2fprotobuf_2fdescriptor_2eproto::InitDefaults();
  }
  this->_cached_size_ = 0;
  (this->name_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  this->number_ = 0;
  this->options_ = (EnumValueOptions *)0x0;
  return;
}

Assistant:

EnumValueDescriptorProto::EnumValueDescriptorProto()
  : ::google::protobuf::Message(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_google_2fprotobuf_2fdescriptor_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:google.protobuf.EnumValueDescriptorProto)
}